

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::UnixSocket::SetTxTimeout(UnixSocket *this,uint32_t timeout_ms)

{
  uint __errnum;
  code *pcVar1;
  bool bVar2;
  char *fname;
  uint *puVar3;
  char *pcVar4;
  
  bVar2 = UnixSocketRaw::SetTxTimeout(&this->sock_raw_,timeout_ms);
  if (bVar2) {
    return;
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  puVar3 = (uint *)__errno_location();
  __errnum = *puVar3;
  pcVar4 = strerror(__errnum);
  LogMessage(kLogError,fname,0x105ce,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms))",(ulong)__errnum,pcVar4);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void SetTxTimeout(uint32_t timeout_ms) {
    PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms));
  }